

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_integer_multiply(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  size_t byteSize;
  ulong uVar1;
  uint uVar2;
  uint32_t *puVar3;
  size_t sVar4;
  uint32_t *puVar5;
  sysbvm_object_tuple_t *integer;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  long value;
  sysbvm_tuple_t sVar15;
  anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *__s;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  sysbvm_decoded_integer_t local_78;
  sysbvm_decoded_integer_t local_58;
  
  if ((right & 0xf) == 0 || (left & 0xf) == 0) {
    local_58.words = (uint32_t *)0x0;
    local_58.inlineWordBuffer[0] = 0;
    local_58.inlineWordBuffer[1] = 0;
    local_58.isNegative = false;
    local_58._1_7_ = 0;
    local_58.wordCount = 0;
    local_78.words = (uint32_t *)0x0;
    local_78.inlineWordBuffer[0] = 0;
    local_78.inlineWordBuffer[1] = 0;
    local_78.isNegative = false;
    local_78._1_7_ = 0;
    local_78.wordCount = 0;
    sysbvm_integer_decodeLargeOrImmediate(context,&local_58,left);
    sysbvm_integer_decodeLargeOrImmediate(context,&local_78,right);
    uVar1 = local_58.wordCount + 1 + local_78.wordCount;
    byteSize = (local_58.wordCount + local_78.wordCount) * 4 + 4;
    integer = sysbvm_context_allocateByteTuple
                        (context,(&(context->roots).largePositiveIntegerType)
                                 [local_58.isNegative != local_78.isNegative],byteSize);
    puVar5 = local_58.words;
    sVar4 = local_58.wordCount;
    puVar3 = local_78.words;
    sVar14 = local_78.wordCount;
    __s = &integer->field_1;
    if (uVar1 != 0) {
      memset(__s,0,byteSize);
    }
    if (uVar1 <= sVar14) {
      sVar14 = uVar1;
    }
    if (sVar14 != 0) {
      uVar6 = 0;
      uVar7 = uVar1;
      do {
        uVar8 = uVar7;
        if (uVar7 < sVar4) {
          uVar8 = sVar4;
        }
        uVar9 = uVar1 - uVar6;
        uVar10 = uVar9;
        if (uVar9 < sVar4) {
          uVar10 = sVar4;
        }
        if (uVar10 != 0) {
          uVar2 = puVar3[uVar6];
          uVar12 = 0;
          uVar10 = 0;
          do {
            if (uVar10 < sVar4) {
              uVar11 = (ulong)puVar5[uVar10];
            }
            else {
              uVar11 = 0;
            }
            if (uVar10 < uVar9) {
              uVar13 = (ulong)*(uint *)((long)__s + uVar10 * 4);
            }
            else {
              uVar13 = 0;
            }
            uVar12 = uVar11 * uVar2 + uVar12 + uVar13;
            *(int *)((long)__s + uVar10 * 4) = (int)uVar12;
            uVar12 = uVar12 >> 0x20;
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
        }
        uVar6 = uVar6 + 1;
        __s = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)((long)__s + 4);
        uVar7 = uVar7 - 1;
      } while (uVar6 != sVar14);
    }
    sVar15 = sysbvm_integer_normalize(context,(sysbvm_integer_t *)integer);
  }
  else {
    value = ((long)right >> 4) * ((long)left >> 4);
    if (value + 0x800000000000000U >> 0x3c != 0) {
      sVar15 = sysbvm_tuple_integer_encodeBigInt64(context,value);
      return sVar15;
    }
    sVar15 = value * 0x10 + 1;
  }
  return sVar15;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_multiply(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);

        sysbvm_stuple_t result = leftValue * rightValue;
        if(leftValue == 0 || rightValue == 0 || leftValue == result / rightValue)
            return sysbvm_tuple_integer_encodeInt64(context, leftValue * rightValue);
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    bool resultIsNegative = decodedLeftInteger.isNegative != decodedRightInteger.isNegative;
    size_t resultWordCount = decodedLeftInteger.wordCount + decodedRightInteger.wordCount + 1;
    sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
    sysbvm_integer_multiplyInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
    return sysbvm_integer_normalize(context, result);
}